

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddWindow.c
# Opt level: O1

int ddWindowConv2(DdManager *table,int low,int high)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  void *__ptr;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  int y;
  
  do {
    uVar6 = high - low;
  } while (uVar6 == 0 || high < low);
  __ptr = malloc((ulong)uVar6 * 4);
  if (__ptr == (void *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
LAB_007ee40b:
    iVar3 = 0;
  }
  else {
    uVar5 = 0;
    do {
      *(undefined4 *)((long)__ptr + uVar5 * 4) = 1;
      uVar5 = uVar5 + 1;
    } while (uVar6 != uVar5);
    iVar3 = table->keys - table->isolated;
    uVar5 = 1;
    if (1 < (int)uVar6) {
      uVar5 = (ulong)uVar6;
    }
    do {
      uVar7 = 0;
      bVar2 = false;
      do {
        if (*(int *)((long)__ptr + uVar7 * 4) != 0) {
          iVar1 = (int)uVar7;
          y = low + iVar1 + 1;
          iVar4 = cuddSwapInPlace(table,low + iVar1,y);
          if ((iVar4 == 0) ||
             ((iVar3 <= iVar4 && (iVar4 = cuddSwapInPlace(table,low + iVar1,y), iVar4 == 0)))) {
            free(__ptr);
            goto LAB_007ee40b;
          }
          if (iVar4 < iVar3) {
            if ((long)uVar7 < (long)(int)(uVar6 - 1)) {
              *(undefined4 *)((long)__ptr + uVar7 * 4 + 4) = 1;
            }
            bVar2 = true;
            if (uVar7 != 0) {
              *(undefined4 *)((long)__ptr + uVar7 * 4 + -4) = 1;
            }
          }
          *(undefined4 *)((long)__ptr + uVar7 * 4) = 0;
          iVar3 = iVar4;
        }
        uVar7 = uVar7 + 1;
      } while (uVar5 != uVar7);
    } while (bVar2);
    free(__ptr);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int
ddWindowConv2(
  DdManager * table,
  int  low,
  int  high)
{
    int x;
    int res;
    int nwin;
    int newevent;
    int *events;
    int size;

#ifdef DD_DEBUG
    assert(low >= 0 && high < table->size);
#endif

    if (high-low < 1) return(ddWindowConv2(table,low,high));

    nwin = high-low;
    events = ABC_ALLOC(int,nwin);
    if (events == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    for (x=0; x<nwin; x++) {
        events[x] = 1;
    }

    res = table->keys - table->isolated;
    do {
        newevent = 0;
        for (x=0; x<nwin; x++) {
            if (events[x]) {
                size = res;
                res = cuddSwapInPlace(table,x+low,x+low+1);
                if (res == 0) {
                    ABC_FREE(events);
                    return(0);
                }
                if (res >= size) { /* no improvement: undo permutation */
                    res = cuddSwapInPlace(table,x+low,x+low+1);
                    if (res == 0) {
                        ABC_FREE(events);
                        return(0);
                    }
                }
                if (res < size) {
                    if (x < nwin-1)     events[x+1] = 1;
                    if (x > 0)          events[x-1] = 1;
                    newevent = 1;
                }
                events[x] = 0;
#ifdef DD_STATS
                if (res < size) {
                    (void) fprintf(table->out,"-");
                } else {
                    (void) fprintf(table->out,"=");
                }
                fflush(table->out);
#endif
            }
        }
#ifdef DD_STATS
        if (newevent) {
            (void) fprintf(table->out,"|");
            fflush(table->out);
        }
#endif
    } while (newevent);

    ABC_FREE(events);

    return(1);

}